

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdio_transporter.cpp
# Opt level: O1

void __thiscall
lscpp::stdio_transporter::write_message(stdio_transporter *this,string *str,bool newline)

{
  pointer pcVar1;
  undefined7 in_register_00000011;
  _Alloc_hider _Var2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string local_58;
  string local_38;
  
  if ((int)CONCAT71(in_register_00000011,newline) == 0) {
    paVar3 = &local_38.field_2;
    pcVar1 = (str->_M_dataplus)._M_p;
    local_38._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_38,pcVar1,pcVar1 + str->_M_string_length);
    write_message_impl(this,&local_38,true);
    _Var2._M_p = local_38._M_dataplus._M_p;
  }
  else {
    paVar3 = &local_58.field_2;
    pcVar1 = (str->_M_dataplus)._M_p;
    local_58._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_58,pcVar1,pcVar1 + str->_M_string_length);
    std::__cxx11::string::append((char *)&local_58);
    write_message_impl(this,&local_58,false);
    _Var2._M_p = local_58._M_dataplus._M_p;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var2._M_p != paVar3) {
    operator_delete(_Var2._M_p,paVar3->_M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void stdio_transporter::write_message(std::string const &str, bool newline) {
  if (newline) {
#ifdef _WIN32
    write_message_impl(str + "\n");
#else
    write_message_impl(str + "\r\n");
#endif
  } else
    write_message_impl(str, true);
}